

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O0

ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> * __thiscall
coro_io::io_context_pool::get_executor(io_context_pool *this)

{
  vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  *pvVar1;
  size_type sVar2;
  pointer pEVar3;
  vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  *in_RDI;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *ret;
  __int_type i;
  pointer this_00;
  
  pvVar1 = in_RDI + 3;
  LOCK();
  this_00 = (pvVar1->
            super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  (pvVar1->
  super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&(((pvVar1->
                          super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1
                );
  UNLOCK();
  sVar2 = std::
          vector<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
          ::size(in_RDI);
  std::
  vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
                *)(in_RDI + 1),(ulong)this_00 % sVar2);
  pEVar3 = std::
           unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
           ::get((unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
                  *)this_00);
  return pEVar3;
}

Assistant:

coro_io::ExecutorWrapper<> *get_executor() {
    auto i = next_io_context_.fetch_add(1, std::memory_order::relaxed);
    auto *ret = executors[i % io_contexts_.size()].get();
    return ret;
  }